

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_socketpair(int type,int protocol,uv_os_sock_t *fds,int flags0,int flags1)

{
  int iVar1;
  undefined8 in_RAX;
  int *piVar2;
  uint uVar3;
  uv_os_sock_t temp [2];
  undefined8 local_28;
  
  uVar3 = flags0 & flags1 & 0x40;
  local_28 = in_RAX;
  iVar1 = socketpair(1,uVar3 << 5 | type | 0x80000,protocol,(int *)&local_28);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    return -*piVar2;
  }
  if (uVar3 == 0 && (type & 0x800U) == 0) {
    if ((flags0 & 0x40U) != 0) {
      iVar1 = uv__nonblock_ioctl((int)local_28,1);
      if (iVar1 != 0) goto LAB_007fbda1;
    }
    if ((flags1 & 0x40U) != 0) {
      iVar1 = uv__nonblock_ioctl(local_28._4_4_,1);
      if (iVar1 != 0) {
LAB_007fbda1:
        uv__close((int)local_28);
        uv__close(local_28._4_4_);
        return iVar1;
      }
    }
  }
  *fds = (int)local_28;
  fds[1] = local_28._4_4_;
  return 0;
}

Assistant:

int uv_socketpair(int type, int protocol, uv_os_sock_t fds[2], int flags0, int flags1) {
  uv_os_sock_t temp[2];
  int err;
#if defined(__FreeBSD__) || defined(__linux__)
  int flags;

  flags = type | SOCK_CLOEXEC;
  if ((flags0 & UV_NONBLOCK_PIPE) && (flags1 & UV_NONBLOCK_PIPE))
    flags |= SOCK_NONBLOCK;

  if (socketpair(AF_UNIX, flags, protocol, temp))
    return UV__ERR(errno);

  if (flags & UV_FS_O_NONBLOCK) {
    fds[0] = temp[0];
    fds[1] = temp[1];
    return 0;
  }
#else
  if (socketpair(AF_UNIX, type, protocol, temp))
    return UV__ERR(errno);

  if ((err = uv__cloexec(temp[0], 1)))
    goto fail;
  if ((err = uv__cloexec(temp[1], 1)))
    goto fail;
#endif

  if (flags0 & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[0], 1)))
        goto fail;
  if (flags1 & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[1], 1)))
      goto fail;

  fds[0] = temp[0];
  fds[1] = temp[1];
  return 0;

fail:
  uv__close(temp[0]);
  uv__close(temp[1]);
  return err;
}